

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O0

void util::anon_unknown_0::windows1252_to_utf8(string *from,string *to)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  type puVar4;
  auto_any_t in_RSI;
  unicode_char chr;
  char c;
  bool _foreach_continue543;
  auto_any_t _foreach_end543;
  auto_any_t _foreach_cur543;
  auto_any_t _foreach_col543;
  bool warn;
  false_ *in_stack_fffffffffffffe08;
  char (*i) [10];
  undefined6 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe16;
  byte in_stack_fffffffffffffe17;
  auto_any_t end;
  auto_any_t in_stack_fffffffffffffe20;
  unicode_char in_stack_fffffffffffffe2c;
  string *in_stack_fffffffffffffe30;
  logger *in_stack_ffffffffffffff40;
  bool local_49;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *local_30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_28;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *local_20;
  byte local_11;
  auto_any_t local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::clear();
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)local_10);
  local_11 = 0;
  local_28 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             boost::foreach_detail_::contain<std::__cxx11::string_const>
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_10,
                        (false_ *)
                        CONCAT17(in_stack_fffffffffffffe17,
                                 CONCAT16(in_stack_fffffffffffffe16,in_stack_fffffffffffffe10)));
  local_20 = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
              *)&local_28;
  bVar2 = boost::iostreams::detail::
          indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
          ::can_write(local_20);
  if (!bVar2) {
    local_38._M_current =
         (char *)boost::foreach_detail_::begin<std::__cxx11::string,mpl_::bool_<true>>
                           (local_10,(type2type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::bool_<true>_>
                                      *)CONCAT17(in_stack_fffffffffffffe17,
                                                 CONCAT16(in_stack_fffffffffffffe16,
                                                          in_stack_fffffffffffffe10)),
                            in_stack_fffffffffffffe08);
    local_30 = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                *)&local_38;
    bVar2 = boost::iostreams::detail::
            indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
            ::can_write(local_30);
    if (!bVar2) {
      local_48._M_current =
           (char *)boost::foreach_detail_::end<std::__cxx11::string,mpl_::bool_<true>>
                             (local_10,(type2type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::bool_<true>_>
                                        *)CONCAT17(in_stack_fffffffffffffe17,
                                                   CONCAT16(in_stack_fffffffffffffe16,
                                                            in_stack_fffffffffffffe10)),
                              in_stack_fffffffffffffe08);
      local_40 = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                  *)&local_48;
      bVar2 = boost::iostreams::detail::
              indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
              ::can_write(local_40);
      if (!bVar2) {
        local_49 = true;
        end = local_10;
        while( true ) {
          in_stack_fffffffffffffe17 = 0;
          if ((local_49 & 1U) != 0) {
            bVar2 = boost::foreach_detail_::done<std::__cxx11::string,mpl_::bool_<true>>
                              (in_stack_fffffffffffffe20,end,
                               (type2type<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_mpl_::bool_<true>_>
                                *)(ulong)CONCAT16(in_stack_fffffffffffffe16,
                                                  in_stack_fffffffffffffe10));
            in_stack_fffffffffffffe17 = bVar2 ^ 0xff;
          }
          if ((in_stack_fffffffffffffe17 & 1) == 0) break;
          bVar2 = boost::foreach_detail_::set_false(&local_49);
          if (!bVar2) {
            puVar4 = boost::foreach_detail_::deref<std::__cxx11::string,mpl_::bool_<true>>
                               ((auto_any_t)
                                CONCAT17(in_stack_fffffffffffffe17,
                                         CONCAT16(in_stack_fffffffffffffe16,
                                                  in_stack_fffffffffffffe10)),
                                (type2type<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_mpl_::bool_<true>_>
                                 *)in_stack_fffffffffffffe08);
            uVar1 = *puVar4;
            while (((local_49 ^ 0xffU) & 1) != 0) {
              uVar3 = (uint)(byte)uVar1;
              if ((0x7f < uVar3) && (uVar3 < 0xa0)) {
                in_stack_fffffffffffffe16 =
                     (local_11 & 1) != 0 ||
                     *(int *)((anonymous_namespace)::windows1252_replacements +
                             (ulong)(uVar3 - 0x80) * 4) == 0x5f;
                local_11 = in_stack_fffffffffffffe16;
              }
              utf8_write(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
              local_49 = true;
            }
          }
          if ((local_49 & 1U) != 0) {
            boost::foreach_detail_::next<std::__cxx11::string,mpl_::bool_<true>>
                      ((auto_any_t)
                       CONCAT17(in_stack_fffffffffffffe17,
                                CONCAT16(in_stack_fffffffffffffe16,in_stack_fffffffffffffe10)),
                       (type2type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::bool_<true>_>
                        *)in_stack_fffffffffffffe08);
          }
        }
      }
    }
  }
  if ((local_11 & 1) != 0) {
    i = (char (*) [10])&stack0xfffffffffffffe30;
    logger::logger((logger *)
                   CONCAT17(in_stack_fffffffffffffe17,
                            CONCAT16(in_stack_fffffffffffffe16,in_stack_fffffffffffffe10)),
                   (log_level)((ulong)i >> 0x20));
    logger::operator<<((logger *)
                       CONCAT17(in_stack_fffffffffffffe17,
                                CONCAT16(in_stack_fffffffffffffe16,in_stack_fffffffffffffe10)),i);
    logger::~logger(in_stack_ffffffffffffff40);
  }
  return;
}

Assistant:

void windows1252_to_utf8(const std::string & from, std::string & to) {
	
	to.clear();
	to.reserve(from.size()); // optimistically, most strings only have ASCII characters
	
	bool warn = false;
	
	BOOST_FOREACH(char c, from) {
		
		// Windows-1252 maps almost directly to Unicode - yay!
		unicode_char chr = boost::uint8_t(c);
		if(chr >= 128 && chr < 160) {
			chr = windows1252_replacements[chr - 128];
			warn = warn || chr == replacement_char;
		}
		
		utf8_write(to, chr);
	}
	
	if(warn) {
		log_warning << "Unexpected data while converting from Windows-1252 to UTF-8.";
	}
	
}